

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O1

void xmlSAX2ExternalSubset(void *ctx,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  undefined4 uVar1;
  undefined4 uVar2;
  code *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  int iVar8;
  xmlParserInputPtr input;
  xmlDtdPtr pxVar9;
  void *pvVar10;
  xmlChar *pxVar11;
  xmlParserInputPtr input_00;
  ulong uVar12;
  ulong uVar13;
  
  if ((((SystemID != (xmlChar *)0x0 && ctx != (void *)0x0) &&
       ((*(byte *)((long)ctx + 0x236) & 0x80) == 0)) &&
      ((*(int *)((long)ctx + 0x9c) != 0 || (*(int *)((long)ctx + 0x1b0) != 0)))) &&
     ((*(int *)((long)ctx + 0x18) != 0 && (*(long *)((long)ctx + 0x10) != 0)))) {
    if ((*ctx == 0) || (pcVar3 = *(code **)(*ctx + 0x20), pcVar3 == (code *)0x0)) {
      input = (xmlParserInputPtr)0x0;
    }
    else {
      input = (xmlParserInputPtr)(*pcVar3)(*(undefined8 *)((long)ctx + 8),ExternalID,SystemID);
    }
    if (input != (xmlParserInputPtr)0x0) {
      pxVar9 = xmlNewDtd(*(xmlDocPtr *)((long)ctx + 0x10),name,ExternalID,SystemID);
      if (pxVar9 == (xmlDtdPtr)0x0) {
        xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
        xmlFreeInputStream(input);
        return;
      }
      uVar4 = *(undefined8 *)((long)ctx + 0x28);
      uVar5 = *(undefined8 *)((long)ctx + 0x38);
      uVar1 = *(undefined4 *)((long)ctx + 0x40);
      uVar2 = *(undefined4 *)((long)ctx + 0x44);
      uVar6 = *(undefined8 *)((long)ctx + 0x48);
      *(undefined8 *)((long)ctx + 0x28) = 0;
      pvVar10 = (*xmlMalloc)(0x28);
      *(void **)((long)ctx + 0x48) = pvVar10;
      if (pvVar10 == (void *)0x0) {
        xmlCtxtErrMemory((xmlParserCtxtPtr)ctx);
      }
      else {
        *(undefined8 *)((long)ctx + 0x40) = 0x500000000;
        *(undefined8 *)((long)ctx + 0x38) = 0;
        iVar8 = xmlCtxtPushInput((xmlParserCtxtPtr)ctx,input);
        if (-1 < iVar8) {
          if (input->filename == (char *)0x0) {
            pxVar11 = xmlCanonicPath(SystemID);
            input->filename = (char *)pxVar11;
          }
          input->line = 1;
          input->col = 1;
          pxVar11 = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 0x20);
          input->base = pxVar11;
          input->cur = pxVar11;
          input->free = (xmlParserInputDeallocate)0x0;
          xmlParseExternalSubset((xmlParserCtxtPtr)ctx,ExternalID,SystemID);
          iVar8 = *(int *)((long)ctx + 0x40);
          while (1 < iVar8) {
            input_00 = xmlCtxtPopInput((xmlParserCtxtPtr)ctx);
            xmlFreeInputStream(input_00);
            iVar8 = *(int *)((long)ctx + 0x40);
          }
          lVar7 = *(long *)((long)ctx + 0x38);
          uVar13 = *(long *)(lVar7 + 0x20) - *(long *)(lVar7 + 0x18);
          uVar12 = 0xffffffffffffffff;
          if (!CARRY8(uVar13,*(ulong *)(lVar7 + 0x40))) {
            uVar12 = uVar13 + *(ulong *)(lVar7 + 0x40);
          }
          if (CARRY8(uVar12,*(ulong *)((long)ctx + 0x2c0))) {
            *(undefined8 *)((long)ctx + 0x2c0) = 0xffffffffffffffff;
          }
          else {
            *(ulong *)((long)ctx + 0x2c0) = uVar12 + *(ulong *)((long)ctx + 0x2c0);
          }
        }
      }
      xmlFreeInputStream(input);
      (*xmlFree)(*(void **)((long)ctx + 0x48));
      *(undefined8 *)((long)ctx + 0x38) = uVar5;
      *(undefined4 *)((long)ctx + 0x40) = uVar1;
      *(undefined4 *)((long)ctx + 0x44) = uVar2;
      *(undefined8 *)((long)ctx + 0x48) = uVar6;
      if ((*(xmlChar **)((long)ctx + 0x28) != (xmlChar *)0x0) &&
         ((*(xmlDictPtr *)((long)ctx + 0x1c8) == (xmlDictPtr)0x0 ||
          (iVar8 = xmlDictOwns(*(xmlDictPtr *)((long)ctx + 0x1c8),*(xmlChar **)((long)ctx + 0x28)),
          iVar8 == 0)))) {
        (*xmlFree)(*(void **)((long)ctx + 0x28));
      }
      *(undefined8 *)((long)ctx + 0x28) = uVar4;
    }
  }
  return;
}

Assistant:

void
xmlSAX2ExternalSubset(void *ctx, const xmlChar *name,
	       const xmlChar *ExternalID, const xmlChar *SystemID)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    if (ctx == NULL) return;
    if ((SystemID != NULL) &&
        ((ctxt->options & XML_PARSE_NO_XXE) == 0) &&
        (((ctxt->validate) || (ctxt->loadsubset)) &&
	 (ctxt->wellFormed && ctxt->myDoc))) {
	/*
	 * Try to fetch and parse the external subset.
	 */
	xmlParserInputPtr oldinput;
	int oldinputNr;
	int oldinputMax;
	xmlParserInputPtr *oldinputTab;
	xmlParserInputPtr input = NULL;
	const xmlChar *oldencoding;
        unsigned long consumed;
        size_t buffered;

	/*
	 * Ask the Entity resolver to load the damn thing
	 */
	if ((ctxt->sax != NULL) && (ctxt->sax->resolveEntity != NULL))
	    input = ctxt->sax->resolveEntity(ctxt->userData, ExternalID,
	                                        SystemID);
	if (input == NULL) {
	    return;
	}

	if (xmlNewDtd(ctxt->myDoc, name, ExternalID, SystemID) == NULL) {
            xmlSAX2ErrMemory(ctxt);
            xmlFreeInputStream(input);
            return;
        }

	/*
	 * make sure we won't destroy the main document context
	 */
	oldinput = ctxt->input;
	oldinputNr = ctxt->inputNr;
	oldinputMax = ctxt->inputMax;
	oldinputTab = ctxt->inputTab;
	oldencoding = ctxt->encoding;
	ctxt->encoding = NULL;

	ctxt->inputTab = (xmlParserInputPtr *)
	                 xmlMalloc(5 * sizeof(xmlParserInputPtr));
	if (ctxt->inputTab == NULL) {
	    xmlSAX2ErrMemory(ctxt);
            goto error;
	}
	ctxt->inputNr = 0;
	ctxt->inputMax = 5;
	ctxt->input = NULL;
	if (xmlCtxtPushInput(ctxt, input) < 0)
            goto error;

	if (input->filename == NULL)
	    input->filename = (char *) xmlCanonicPath(SystemID);
	input->line = 1;
	input->col = 1;
	input->base = ctxt->input->cur;
	input->cur = ctxt->input->cur;
	input->free = NULL;

	/*
	 * let's parse that entity knowing it's an external subset.
	 */
	xmlParseExternalSubset(ctxt, ExternalID, SystemID);

        /*
	 * Free up the external entities
	 */

	while (ctxt->inputNr > 1)
	    xmlFreeInputStream(xmlCtxtPopInput(ctxt));

        consumed = ctxt->input->consumed;
        buffered = ctxt->input->cur - ctxt->input->base;
        if (buffered > ULONG_MAX - consumed)
            consumed = ULONG_MAX;
        else
            consumed += buffered;
        if (consumed > ULONG_MAX - ctxt->sizeentities)
            ctxt->sizeentities = ULONG_MAX;
        else
            ctxt->sizeentities += consumed;

error:
	xmlFreeInputStream(input);
        xmlFree(ctxt->inputTab);

	/*
	 * Restore the parsing context of the main entity
	 */
	ctxt->input = oldinput;
	ctxt->inputNr = oldinputNr;
	ctxt->inputMax = oldinputMax;
	ctxt->inputTab = oldinputTab;
	if ((ctxt->encoding != NULL) &&
	    ((ctxt->dict == NULL) ||
	     (!xmlDictOwns(ctxt->dict, ctxt->encoding))))
	    xmlFree((xmlChar *) ctxt->encoding);
	ctxt->encoding = oldencoding;
	/* ctxt->wellFormed = oldwellFormed; */
    }
}